

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::unexpected(Parser *this)

{
  ostream *poVar1;
  char *pcVar2;
  ParseException *this_00;
  Token local_250;
  Token local_218;
  Token local_1e0;
  stringstream local_198 [8];
  stringstream msg;
  ostream local_188 [376];
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Unexpected \'");
  token(&local_1e0,this);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\' on line ");
  token(&local_218,this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_218.line);
  poVar1 = std::operator<<(poVar1," column ");
  token(&local_250,this);
  std::ostream::operator<<(poVar1,local_250.col);
  Token::~Token(&local_250);
  Token::~Token(&local_218);
  Token::~Token(&local_1e0);
  this_00 = (ParseException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  ParseException::ParseException(this_00,pcVar2);
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void Parser::unexpected() {
    std::stringstream msg;
    msg << "Unexpected '" << token().lexeme.c_str() << "' on line " << token().line << " column " << token().col;
    throw ParseException(msg.str().c_str());
}